

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GrcSymTable.cpp
# Opt level: O1

bool __thiscall GrcSymbolTableEntry::IsIgnorableOffsetAttr(GrcSymbolTableEntry *this)

{
  bool bVar1;
  int iVar2;
  
  bVar1 = IsSequenceAttr(this);
  if (bVar1) {
    bVar1 = false;
  }
  else {
    iVar2 = std::__cxx11::string::compare((char *)this);
    bVar1 = true;
    if (iVar2 != 0) {
      iVar2 = std::__cxx11::string::compare((char *)this);
      if (iVar2 != 0) {
        iVar2 = std::__cxx11::string::compare((char *)this);
        bVar1 = iVar2 == 0;
      }
    }
  }
  return bVar1;
}

Assistant:

bool GrcSymbolTableEntry::IsIgnorableOffsetAttr()
{
	Assert(FitsSymbolType(ksymtGlyphAttr));
	//Symbol psymParent = ParentSymbol();
	return (!IsSequenceAttr()
		&& (m_staFieldName == "gpoint" || m_staFieldName == "xoffset"
				|| m_staFieldName == "yoffset"));
}